

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_CfdAddSignWithPrivkeySimple_Test::TestBody
          (cfdcapi_transaction_CfdAddSignWithPrivkeySimple_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  char *str_buffer;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *tx_string;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  undefined1 in_stack_000003f6;
  undefined1 in_stack_000003f7;
  int in_stack_000003f8;
  uint32_t in_stack_000003fc;
  char *in_stack_00000400;
  char *in_stack_00000408;
  int in_stack_00000414;
  void *in_stack_00000418;
  char *in_stack_00000430;
  char *in_stack_00000438;
  int64_t in_stack_00000440;
  int in_stack_00000448;
  char **in_stack_00000460;
  bool *in_stack_fffffffffffffdc8;
  AssertionResult *in_stack_fffffffffffffdd0;
  CfdErrorCode *in_stack_fffffffffffffdd8;
  CfdErrorCode *lhs;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffdec;
  void *in_stack_fffffffffffffe08;
  AssertionResult *pAVar6;
  char **in_stack_fffffffffffffe60;
  AssertHelper local_160;
  Message local_158;
  undefined4 local_14c;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  undefined4 local_104;
  AssertionResult local_100;
  char *local_f0;
  AssertHelper local_e8;
  Message local_e0;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
             (char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             in_stack_fffffffffffffdd8,(int *)in_stack_fffffffffffffdd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c3faa);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,700,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3c400d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c4062);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(type *)0x3c4096);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x2bd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3c4192);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c420d);
  local_a0 = (char *)0x0;
  pcVar2 = "cRVLMWHogUo51WECRykTbeLNbm5c57iEpSegjdxco3oef6o5dbFi";
  uVar5 = 0;
  uVar4 = 1;
  lhs = (CfdErrorCode *)0x6b22c20;
  local_14 = CfdAddSignWithPrivkeySimple
                       (in_stack_00000418,in_stack_00000414,in_stack_00000408,in_stack_00000400,
                        in_stack_000003fc,in_stack_000003f8,in_stack_00000430,in_stack_00000438,
                        in_stack_00000440,in_stack_00000448,(bool)in_stack_000003f7,
                        (bool)in_stack_000003f6,in_stack_00000460);
  local_b4 = 0;
  pAVar6 = &local_b0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffdec,uVar5),
             (char *)CONCAT44(in_stack_fffffffffffffde4,uVar4),lhs,(int *)pcVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    in_stack_fffffffffffffe60 =
         (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3c4337);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x2c6,(char *)in_stack_fffffffffffffe60);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x3c439a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c43ef);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_d8,"exp_tx_hex","tx_string",TestBody::exp_tx_hex,local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_e0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3c449e);
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x2c9,pcVar3);
      testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      testing::Message::~Message((Message *)0x3c4501);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c4556);
    CfdFreeStringBuffer((char *)lhs);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffe08);
  if (local_14 != 0) {
    local_f0 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(pAVar6,in_stack_fffffffffffffe60);
    local_104 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffdec,uVar5),
               (char *)CONCAT44(in_stack_fffffffffffffde4,uVar4),lhs,(int *)pcVar2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3c4650);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x2d1,pcVar3);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::Message::~Message((Message *)0x3c46ad);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c4702);
    testing::internal::CmpHelperSTREQ((internal *)&local_128,"\"\"","str_buffer","",local_f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
    if (!bVar1) {
      testing::Message::Message(&local_130);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3c4797);
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x2d2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      testing::Message::~Message((Message *)0x3c47f4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c4849);
    CfdFreeStringBuffer((char *)lhs);
    local_f0 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(lhs);
  local_14c = 0;
  pAVar6 = &local_148;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffdec,uVar5),
             (char *)CONCAT44(in_stack_fffffffffffffde4,uVar4),lhs,(int *)pcVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c4919);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x2d8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message((Message *)0x3c4976);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c49cb);
  return;
}

Assistant:

TEST(cfdcapi_transaction, CfdAddSignWithPrivkeySimple) {
  static const char* tx_hex = "0100000002fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000eeffffffef51e1b804cc89d182d279655c3aa89e815b1b309fe287d9b2b55d57b90ec68a0100000000ffffffff02202cb206000000001976a9148280b37df378db99f66f85c95a783a76ac7a6d5988ac9093510d000000001976a9143bde42dbee7e4dbe6a21b2d50ce2f0167faa815988ac11000000";
  static const char* exp_tx_hex = "01000000000102fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000eeffffffef51e1b804cc89d182d279655c3aa89e815b1b309fe287d9b2b55d57b90ec68a010000001716001473a4fc7f4c3cd762c86986f61abb7274d3914bf5ffffffff02202cb206000000001976a9148280b37df378db99f66f85c95a783a76ac7a6d5988ac9093510d000000001976a9143bde42dbee7e4dbe6a21b2d50ce2f0167faa815988ac000247304402205c933cb3e81a1cb298e62e237169714bbc3a73c071d5c95d4b8e96b658913d8a022034075443df871165b5c998ead5e728d269182edde68b8b23a9c52a91d69293d0012102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad11000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* tx_string = nullptr;
  ret = CfdAddSignWithPrivkeySimple(
      handle, kCfdNetworkMainnet, tx_hex,
      "8ac60eb9575db5b2d987e29f301b5b819ea83a5c6579d282d189cc04b8e151ef", 1,
      kCfdP2shP2wpkh, "02715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad",
      "cRVLMWHogUo51WECRykTbeLNbm5c57iEpSegjdxco3oef6o5dbFi",
      112340000, kCfdSigHashAll, false, true, &tx_string);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    EXPECT_STREQ(exp_tx_hex, tx_string);
    CfdFreeStringBuffer(tx_string);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}